

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_connect2cluster(void *ignore)

{
  fio_connect_args args;
  undefined1 auVar1 [48];
  uint7 uStack_7;
  
  if (cluster_data.uuid != 0) {
    fio_force_close(cluster_data.uuid);
  }
  cluster_data.uuid = 0;
  auVar1 = ZEXT3248(CONCAT824(fio_cluster_on_fail,
                              CONCAT816(fio_cluster_on_connect,ZEXT816(0x150349))));
  args._48_8_ = (ulong)uStack_7 << 8;
  args.address = (char *)auVar1._0_8_;
  args.port = (char *)auVar1._8_8_;
  args.on_connect = (_func_void_intptr_t_void_ptr *)auVar1._16_8_;
  args.on_fail = (_func_void_intptr_t_void_ptr *)auVar1._24_8_;
  args.tls = (void *)auVar1._32_8_;
  args.udata = (void *)auVar1._40_8_;
  fio_connect(args);
  return;
}

Assistant:

static void fio_connect2cluster(void *ignore) {
  if (cluster_data.uuid)
    fio_force_close(cluster_data.uuid);
  cluster_data.uuid = 0;
  /* this is called for each child, but not for single a process worker. */
  fio_connect(.address = cluster_data.name, .port = NULL,
              .on_connect = fio_cluster_on_connect,
              .on_fail = fio_cluster_on_fail);
  (void)ignore;
}